

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cpp
# Opt level: O0

void ncnn::resize_bilinear_image(Mat *src,Mat *dst,float *alpha,int *xofs,float *beta,int *yofs)

{
  float fVar1;
  float fVar2;
  int iVar3;
  float *pfVar4;
  float *pfVar5;
  long in_RCX;
  float *in_RDX;
  Mat *in_RSI;
  Mat *in_RDI;
  float *in_R8;
  long in_R9;
  int dx_2;
  float *Dp;
  float *rows1p;
  float *rows0p;
  float b1;
  float b0;
  float a1_1;
  float a0_1;
  float *S1p_1;
  float *S0p;
  int sx_1;
  int dx_1;
  float *rows1p_2;
  float *rows0p_1;
  float *alphap_1;
  float *S1_1;
  float *S0;
  float a1;
  float a0;
  float *S1p;
  int sx;
  int dx;
  float *rows1p_1;
  float *alphap;
  float *S1;
  float *rows0_old;
  int sy;
  int dy;
  int prev_sy1;
  float *rows1;
  float *rows0;
  Mat rowsbuf1;
  Mat rowsbuf0;
  int h;
  int w;
  Allocator *in_stack_fffffffffffffe38;
  size_t in_stack_fffffffffffffe40;
  undefined8 in_stack_fffffffffffffe48;
  int iVar6;
  Mat *this;
  int local_19c;
  float *local_198;
  float *local_190;
  float *local_188;
  int local_15c;
  float *local_148;
  int local_11c;
  float *local_110;
  int local_f0;
  int local_ec;
  float *local_e8;
  float *local_e0;
  Mat local_c8;
  Mat local_80;
  int local_38;
  int local_34;
  long local_30;
  float *local_28;
  long local_20;
  float *local_18;
  Mat *local_10;
  Mat *local_8;
  
  iVar6 = (int)((ulong)in_stack_fffffffffffffe48 >> 0x20);
  local_34 = in_RSI->w;
  local_38 = in_RSI->h;
  this = (Mat *)0x4;
  local_30 = in_R9;
  local_28 = in_R8;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  Mat::Mat((Mat *)0x4,iVar6,in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
  Mat::Mat(this,iVar6,in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
  local_e0 = Mat::operator_cast_to_float_(&local_80);
  local_e8 = Mat::operator_cast_to_float_(&local_c8);
  local_ec = -2;
  for (local_f0 = 0; pfVar5 = local_e0, local_f0 < local_38; local_f0 = local_f0 + 1) {
    iVar6 = *(int *)(local_30 + (long)local_f0 * 4);
    if (iVar6 != local_ec) {
      if (iVar6 == local_ec + 1) {
        local_e0 = local_e8;
        local_e8 = pfVar5;
        pfVar4 = Mat::row(local_8,iVar6 + 1);
        local_110 = local_18;
        for (local_11c = 0; local_11c < local_34; local_11c = local_11c + 1) {
          pfVar5[local_11c] =
               pfVar4[*(int *)(local_20 + (long)local_11c * 4)] * *local_110 +
               (pfVar4 + *(int *)(local_20 + (long)local_11c * 4))[1] * local_110[1];
          local_110 = local_110 + 2;
        }
      }
      else {
        pfVar5 = Mat::row(local_8,iVar6);
        pfVar4 = Mat::row(local_8,iVar6 + 1);
        local_148 = local_18;
        for (local_15c = 0; local_15c < local_34; local_15c = local_15c + 1) {
          iVar3 = *(int *)(local_20 + (long)local_15c * 4);
          fVar1 = *local_148;
          fVar2 = local_148[1];
          local_e0[local_15c] = pfVar5[iVar3] * fVar1 + (pfVar5 + iVar3)[1] * fVar2;
          local_e8[local_15c] = pfVar4[iVar3] * fVar1 + (pfVar4 + iVar3)[1] * fVar2;
          local_148 = local_148 + 2;
        }
      }
    }
    fVar1 = *local_28;
    fVar2 = local_28[1];
    local_188 = local_e0;
    local_190 = local_e8;
    local_198 = Mat::row(local_10,local_f0);
    for (local_19c = 0; local_19c < local_34; local_19c = local_19c + 1) {
      *local_198 = *local_188 * fVar1 + *local_190 * fVar2;
      local_198 = local_198 + 1;
      local_190 = local_190 + 1;
      local_188 = local_188 + 1;
    }
    local_28 = local_28 + 2;
    local_ec = iVar6;
  }
  Mat::~Mat((Mat *)0x6b727d);
  Mat::~Mat((Mat *)0x6b728a);
  return;
}

Assistant:

static void resize_bilinear_image(const Mat& src, Mat& dst, float* alpha, int* xofs, float* beta, int* yofs)
{
    int w = dst.w;
    int h = dst.h;

    // loop body
    Mat rowsbuf0(w);
    Mat rowsbuf1(w);
    float* rows0 = rowsbuf0;
    float* rows1 = rowsbuf1;

    int prev_sy1 = -2;

    for (int dy = 0; dy < h; dy++)
    {
        int sy = yofs[dy];

        if (sy == prev_sy1)
        {
            // reuse all rows
        }
        else if (sy == prev_sy1 + 1)
        {
            // hresize one row
            float* rows0_old = rows0;
            rows0 = rows1;
            rows1 = rows0_old;
            const float* S1 = src.row(sy + 1);

            const float* alphap = alpha;
            float* rows1p = rows1;
            for (int dx = 0; dx < w; dx++)
            {
                int sx = xofs[dx];
                const float* S1p = S1 + sx;

                float a0 = alphap[0];
                float a1 = alphap[1];
                rows1p[dx] = S1p[0] * a0 + S1p[1] * a1;

                alphap += 2;
            }
        }
        else
        {
            // hresize two rows
            const float* S0 = src.row(sy);
            const float* S1 = src.row(sy + 1);

            const float* alphap = alpha;
            float* rows0p = rows0;
            float* rows1p = rows1;
            for (int dx = 0; dx < w; dx++)
            {
                int sx = xofs[dx];
                const float* S0p = S0 + sx;
                const float* S1p = S1 + sx;

                float a0 = alphap[0];
                float a1 = alphap[1];
                rows0p[dx] = S0p[0] * a0 + S0p[1] * a1;
                rows1p[dx] = S1p[0] * a0 + S1p[1] * a1;

                alphap += 2;
            }
        }

        prev_sy1 = sy;

        // vresize
        float b0 = beta[0];
        float b1 = beta[1];

        float* rows0p = rows0;
        float* rows1p = rows1;
        float* Dp = dst.row(dy);
        for (int dx = 0; dx < w; dx++)
        {
            //             D[x] = rows0[x]*b0 + rows1[x]*b1;
            *Dp++ = *rows0p++ * b0 + *rows1p++ * b1;
        }

        beta += 2;
    }
}